

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::reduceDB(SAT *this)

{
  Clause *pCVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Clause **ppCVar5;
  Clause **ppCVar6;
  SAT *in_RDI;
  Clause *in_stack_00000008;
  SAT *in_stack_00000010;
  uint j;
  uint i;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_10;
  uint local_c;
  
  ppCVar5 = ::vec::operator_cast_to_Clause__((vec *)&in_RDI->learnts);
  ppCVar6 = ::vec::operator_cast_to_Clause__((vec *)&in_RDI->learnts);
  uVar3 = vec<Clause_*>::size(&in_RDI->learnts);
  std::sort<Clause**,activity_lt>(ppCVar5,ppCVar6 + uVar3);
  local_10 = 0;
  local_c = 0;
  while (uVar3 = local_c, uVar4 = vec<Clause_*>::size(&in_RDI->learnts), uVar3 < uVar4 >> 1) {
    vec<Clause_*>::operator[](&in_RDI->learnts,local_c);
    bVar2 = locked(in_RDI,(Clause *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    if (bVar2) {
      ppCVar5 = vec<Clause_*>::operator[](&in_RDI->learnts,local_c);
      pCVar1 = *ppCVar5;
      ppCVar5 = vec<Clause_*>::operator[](&in_RDI->learnts,local_10);
      *ppCVar5 = pCVar1;
      local_10 = local_10 + 1;
    }
    else {
      vec<Clause_*>::operator[](&in_RDI->learnts,local_c);
      removeClause(in_stack_00000010,in_stack_00000008);
    }
    local_c = local_c + 1;
  }
  for (; uVar3 = vec<Clause_*>::size(&in_RDI->learnts), local_c < uVar3; local_c = local_c + 1) {
    ppCVar5 = vec<Clause_*>::operator[](&in_RDI->learnts,local_c);
    pCVar1 = *ppCVar5;
    ppCVar5 = vec<Clause_*>::operator[](&in_RDI->learnts,local_10);
    *ppCVar5 = pCVar1;
    local_10 = local_10 + 1;
  }
  vec<Clause_*>::resize(&in_RDI->learnts,local_10);
  if (0 < so.verbosity) {
    printf("%% Pruned %d learnt clauses\n",(ulong)(local_c - local_10));
  }
  return;
}

Assistant:

void SAT::reduceDB() {
	unsigned int i;
	unsigned int j;

	std::sort((Clause**)learnts, (Clause**)learnts + learnts.size(), activity_lt());

	for (i = j = 0; i < learnts.size() / 2; i++) {
		if (!locked(*learnts[i])) {
			removeClause(*learnts[i]);
		} else {
			learnts[j++] = learnts[i];
		}
	}
	for (; i < learnts.size(); i++) {
		learnts[j++] = learnts[i];
	}
	learnts.resize(j);

	if (so.verbosity >= 1) {
		printf("%% Pruned %d learnt clauses\n", i - j);
	}
}